

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_unix.cpp
# Opt level: O2

Ref trun::DynLibLinux::Create(void)

{
  Version VVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ref RVar2;
  _func_int **local_18;
  Version VStack_10;
  
  std::make_shared<trun::DynLibLinux>();
  VVar1 = VStack_10;
  VStack_10.prefix[0] = '\0';
  VStack_10.prefix[1] = '\0';
  VStack_10.prefix[2] = '\0';
  VStack_10.prefix[3] = '\0';
  VStack_10.data = (anon_union_4_2_43ae805c_for_data)0x0;
  in_RDI->_vptr_IDynLibrary = local_18;
  in_RDI->version = VVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&VStack_10);
  RVar2.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar2.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ref)RVar2.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IDynLibrary::Ref DynLibLinux::Create() {
    return std::make_shared<DynLibLinux>();
}